

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::slotRemoveGraphic(Fifteen *this)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  Fifteen *this_local;
  
  this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                      (&this->controller);
  bVar1 = Controller::removeGraphic(this_00);
  if (bVar1) {
    redrawTiles(this);
  }
  this_01 = std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::operator->(&this->menuBar);
  MenuBar::setActionMenuState(this_01,REM_GRAPHIC,false);
  this_02 = std::unique_ptr<Panel,_std::default_delete<Panel>_>::operator->(&this->panel);
  Panel::setBoardMode(this_02,NUMERIC);
  return;
}

Assistant:

void Fifteen::slotRemoveGraphic()
{
    if ( controller->removeGraphic() )
    {
        redrawTiles();
    }
    menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, false );
    panel->setBoardMode( BoardMode::NUMERIC );
}